

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O1

void __thiscall
Diligent::SPIRVShaderResources::SPIRVShaderResources
          (SPIRVShaderResources *this,IMemoryAllocator *Allocator,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_binary,ShaderDesc *shaderDesc,
          char *CombinedSamplerSuffix,bool LoadShaderStageInputs,bool LoadUniformBufferReflection,
          string *EntryPoint)

{
  Dim DVar1;
  size_t sVar2;
  void *ptr;
  uint uVar3;
  char *pcVar4;
  undefined8 uVar5;
  pointer RangeStart;
  pointer RangeEnd;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *puVar6;
  bool bVar7;
  ExecutionModel model;
  int iVar8;
  uint32_t uVar9;
  string *psVar10;
  long lVar11;
  size_t sVar12;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSVar13;
  string *psVar14;
  SPIRType *pSVar15;
  SPIRVShaderResourceAttribs *pSVar16;
  char (*Args_1) [22];
  Char *pCVar17;
  SPIRVShaderStageInputAttribs *pSVar18;
  IMemoryAllocator *pIVar19;
  byte bVar20;
  char (*Args_1_00) [27];
  char (*Args_1_01) [44];
  char (*Args_1_02) [36];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  long lVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  ShaderDesc *pSVar23;
  Uint32 UVar24;
  long lVar25;
  char *pcVar26;
  Resource *pRVar27;
  Resource *SmplImg;
  size_t sVar28;
  __node_base Res;
  Resource *pRVar29;
  Resource *ub;
  EntryPoint *pEVar30;
  array<unsigned_int,_3UL> *paVar31;
  string msg;
  StringPool ResourceNamesPool;
  vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  UBReflections;
  ResourceCounters ResCounters;
  SmallVector<diligent_spirv_cross::EntryPoint,_8UL> EntryPoints;
  Compiler Compiler;
  ShaderResources resources;
  Parser parser;
  char (*in_stack_ffffffffffffceb8) [17];
  Uint32 local_3134;
  undefined1 local_3128 [16];
  vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  local_3118;
  Resource **local_3100;
  Resource **local_30f8;
  __node_base *local_30f0;
  undefined4 local_30e4;
  ShaderDesc *local_30e0;
  IMemoryAllocator *local_30d8;
  string *local_30d0;
  StringPool local_30c8;
  vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  local_30a8;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *local_3088;
  array<unsigned_int,_3UL> *local_3080;
  char *local_3078;
  ID *local_3070;
  SPIRVShaderResourceAttribs *local_3068;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3060;
  ResourceCounters local_3048;
  SmallVector<diligent_spirv_cross::EntryPoint,_8UL> local_3018;
  Compiler local_2ec0;
  undefined1 local_2258 [16];
  Resource local_2248 [8];
  vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  local_20c0 [17];
  Resource *local_1f28;
  size_t local_1f20;
  Resource *local_1bf8;
  undefined4 local_1bf0;
  undefined4 uStack_1bec;
  ShaderCodeVariableDesc local_1a60 [10];
  Resource *local_18c8;
  undefined4 local_18c0;
  undefined4 uStack_18bc;
  Resource *local_1730;
  undefined4 local_1728;
  undefined4 uStack_1724;
  __node_base local_1598;
  Uint32 local_1590;
  undefined4 uStack_158c;
  ShaderCodeVariableDescX local_f38 [3];
  Resource *local_da0;
  undefined4 local_d98;
  undefined4 uStack_d94;
  undefined1 local_858 [2088];
  
  local_3088 = &this->m_UBReflectionBuffer;
  this->m_StorageBufferOffset = 0;
  this->m_StorageImageOffset = 0;
  this->m_SampledImageOffset = 0;
  this->m_AtomicCounterOffset = 0;
  this->m_SeparateSamplerOffset = 0;
  this->m_SeparateImageOffset = 0;
  this->m_InputAttachmentOffset = 0;
  this->m_AccelStructOffset = 0;
  this->m_CombinedSamplerSuffix = (char *)0x0;
  this->m_ShaderName = (char *)0x0;
  (this->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  (this->m_MemoryBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false> =
       (_Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>)0x0;
  (this->m_MemoryBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  this->m_TotalResources = 0;
  this->m_NumShaderStageInputs = 0;
  this->m_ShaderType = shaderDesc->ShaderType;
  (this->m_ComputeGroupSize)._M_elems[0] = 0;
  (this->m_ComputeGroupSize)._M_elems[1] = 0;
  *(undefined8 *)((long)(this->m_ComputeGroupSize)._M_elems + 5) = 0;
  local_3060.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_3060.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_3060.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar26 = CombinedSamplerSuffix;
  diligent_spirv_cross::Parser::Parser((Parser *)local_858,&local_3060);
  if (local_3060.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3060.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3060.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3060.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  diligent_spirv_cross::Parser::parse((Parser *)local_858);
  local_30d0 = (string *)((ulong)local_858._1740_8_ >> 0x30);
  this->m_IsHLSLSource = SUB81(local_858._1740_8_,6);
  local_30d8 = Allocator;
  diligent_spirv_cross::Compiler::Compiler(&local_2ec0,(ParsedIR *)local_858);
  model = ShaderTypeToSpvExecutionModel(shaderDesc->ShaderType);
  local_30e0 = shaderDesc;
  local_3078 = CombinedSamplerSuffix;
  diligent_spirv_cross::Compiler::get_entry_points_and_stages(&local_3018,&local_2ec0);
  pSVar23 = local_30e0;
  if (local_3018.super_VectorView<diligent_spirv_cross::EntryPoint>.buffer_size != 0) {
    lVar21 = local_3018.super_VectorView<diligent_spirv_cross::EntryPoint>.buffer_size * 0x28;
    pEVar30 = local_3018.super_VectorView<diligent_spirv_cross::EntryPoint>.ptr;
    do {
      if (pEVar30->execution_model == model) {
        if (EntryPoint->_M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)EntryPoint);
        }
        else {
          local_3128._0_8_ = GetShaderTypeLiteralName(pSVar23->ShaderType);
          pcVar26 = (char *)pSVar23;
          FormatString<char[35],char_const*,char[36],char_const*,char[20],std::__cxx11::string,char[17]>
                    ((string *)local_2258,(Diligent *)"More than one entry point of type ",
                     (char (*) [35])local_3128,(char **)" found in SPIRV binary for shader \'",
                     (char (*) [36])pSVar23,(char **)"\'. The first one (\'",
                     (char (*) [20])EntryPoint,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\') will be used.",in_stack_ffffffffffffceb8);
          if (DebugMessageCallback != (undefined *)0x0) {
            pcVar26 = (char *)0x0;
            (*(code *)DebugMessageCallback)(1,local_2258._0_8_,0,0);
          }
          if ((Resource *)local_2258._0_8_ != local_2248) {
            operator_delete((void *)local_2258._0_8_,local_2248[0]._0_8_ + 1);
          }
        }
      }
      pEVar30 = pEVar30 + 1;
      lVar21 = lVar21 + -0x28;
    } while (lVar21 != 0);
  }
  pSVar23 = local_30e0;
  if (EntryPoint->_M_string_length == 0) {
    local_2258._0_8_ = GetShaderTypeLiteralName(local_30e0->ShaderType);
    pcVar26 = "Unable to find entry point of type ";
    LogError<true,char[36],char_const*,char[30],char_const*,char[2]>
              (false,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x19c,(char (*) [36])"Unable to find entry point of type ",(char **)local_2258,
               (char (*) [30])0x6e821f,(char **)pSVar23,(char (*) [2])0x6b7dd3);
  }
  diligent_spirv_cross::Compiler::set_entry_point(&local_2ec0,EntryPoint,model);
  diligent_spirv_cross::Compiler::get_shader_resources((ShaderResources *)local_2258,&local_2ec0);
  if (CONCAT44(local_2258._12_4_,local_2258._8_4_) == 0) {
    lVar21 = 0;
  }
  else {
    pRVar27 = (Resource *)(local_2258._0_8_ + CONCAT44(local_2258._12_4_,local_2258._8_4_) * 0x30);
    lVar21 = 0;
    pRVar29 = (Resource *)local_2258._0_8_;
    do {
      psVar10 = diligent_spirv_cross::Compiler::get_name_abi_cxx11_
                          (&local_2ec0,(ID)(pRVar29->id).id);
      if (psVar10->_M_string_length == 0) {
        psVar10 = &pRVar29->name;
      }
      psVar14 = &pRVar29->name;
      if (((ulong)local_30d0 & 1) != 0) {
        psVar14 = psVar10;
      }
      lVar21 = lVar21 + psVar14->_M_string_length + 1;
      pRVar29 = pRVar29 + 1;
    } while (pRVar29 != pRVar27);
  }
  local_3128._0_8_ = local_20c0;
  local_3128._8_8_ = local_1a60;
  local_3118.
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_18c8;
  local_3118.
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_1730;
  local_3118.
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_f38;
  local_3100 = &local_da0;
  local_30f8 = &local_1bf8;
  local_30f0 = &local_1598;
  lVar11 = 0;
  do {
    Args_1_00 = *(char (**) [27])(local_3128 + lVar11);
    pcVar4 = *Args_1_00;
    if (*(long *)(pcVar4 + 8) != 0) {
      Args_1_00 = *(char (**) [27])*Args_1_00;
      lVar25 = 0;
      do {
        lVar21 = lVar21 + *(long *)(*Args_1_00 + lVar25 + 0x18) + 1;
        lVar25 = lVar25 + 0x30;
      } while (*(long *)(pcVar4 + 8) * 0x30 != lVar25);
    }
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x40);
  if (local_3078 != (char *)0x0) {
    sVar12 = strlen(local_3078);
    lVar21 = lVar21 + sVar12 + 1;
  }
  if ((pSVar23->super_DeviceObjectAttribs).Name == (Char *)0x0) {
    FormatString<char[26],char[27]>
              ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"shaderDesc.Name != nullptr",Args_1_00);
    Args_1_00 = (char (*) [27])0x1bc;
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x1bc);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  local_3080 = &this->m_ComputeGroupSize;
  sVar12 = strlen((pSVar23->super_DeviceObjectAttribs).Name);
  sVar28 = lVar21 + sVar12 + 1;
  bVar20 = local_1f20 != 0 & this->m_IsHLSLSource & LoadShaderStageInputs;
  Args_1 = (char (*) [22])0x0;
  local_30e4 = (undefined4)CONCAT71((int7)((ulong)Args_1_00 >> 8),bVar20);
  if (bVar20 == 1) {
    pSVar13 = diligent_spirv_cross::Compiler::get_declared_extensions_abi_cxx11_(&local_2ec0);
    sVar2 = (pSVar13->
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).buffer_size;
    if (sVar2 != 0) {
      pbVar22 = (pSVar13->
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).ptr;
      lVar21 = sVar2 << 5;
      do {
        iVar8 = std::__cxx11::string::compare((char *)pbVar22);
        if (iVar8 == 0) {
          if (local_1f20 != 0) {
            lVar21 = local_1f20 * 0x30;
            Args_1 = (char (*) [22])0x0;
            pRVar29 = local_1f28;
            do {
              psVar10 = &pRVar29->name;
              bVar7 = diligent_spirv_cross::Compiler::has_decoration
                                (&local_2ec0,(ID)*(uint32_t *)((long)(psVar10 + -1) + 0x10),
                                 DecorationHlslSemanticGOOGLE);
              if (bVar7) {
                psVar14 = diligent_spirv_cross::Compiler::get_decoration_string_abi_cxx11_
                                    (&local_2ec0,(ID)*(uint32_t *)((long)(psVar10 + -1) + 0x10),
                                     DecorationHlslSemanticGOOGLE);
                sVar28 = sVar28 + psVar14->_M_string_length + 1;
                Args_1 = (char (*) [22])(ulong)((int)Args_1 + 1);
              }
              else {
                FormatString<char[15],std::__cxx11::string,char[141]>
                          ((string *)local_3128,(Diligent *)"Shader input \'",(char (*) [15])psVar10
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "\' does not have DecorationHlslSemanticGOOGLE decoration, which is unexpected as the shader declares SPV_GOOGLE_hlsl_functionality1 extension"
                           ,(char (*) [141])pcVar26);
                if (DebugMessageCallback != (undefined *)0x0) {
                  pcVar26 = (char *)0x0;
                  (*(code *)DebugMessageCallback)(2,local_3128._0_8_,0,0);
                }
                if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     *)local_3128._0_8_ != &local_3118) {
                  operator_delete((void *)local_3128._0_8_,
                                  (long)local_3118.
                                        super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1);
                }
              }
              pRVar29 = (Resource *)(psVar10 + 1);
              lVar21 = lVar21 + -0x30;
            } while (lVar21 != 0);
          }
          goto LAB_002a7837;
        }
        pbVar22 = pbVar22 + 1;
        lVar21 = lVar21 + -0x20;
      } while (lVar21 != 0);
    }
    if (this->m_IsHLSLSource == true) {
      FormatString<char[28],char_const*,char[366]>
                ((string *)local_3128,(Diligent *)"SPIRV byte code of shader \'",
                 (char (*) [28])local_30e0,
                 (char **)
                 "\' does not use SPV_GOOGLE_hlsl_functionality1 extension. As a result, it is not possible to get semantics of shader inputs and map them to proper locations. The shader will still work correctly if all attributes are declared in ascending order without any gaps. Enable SPV_GOOGLE_hlsl_functionality1 in your compiler to allow proper mapping of vertex shader inputs."
                 ,(char (*) [366])pcVar26);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,local_3128._0_8_,0,0,0);
      }
      if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           *)local_3128._0_8_ != &local_3118) {
        operator_delete((void *)local_3128._0_8_,
                        (long)local_3118.
                              super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
    Args_1 = (char (*) [22])0x0;
    local_30e4 = 0;
  }
LAB_002a7837:
  local_3048.NumAccelStructs = local_1590;
  local_30c8.m_ReservedSize = 0;
  local_30c8.m_pAllocator = (IMemoryAllocator *)0x0;
  local_30c8.m_pBuffer = (Char *)0x0;
  local_30c8.m_pCurrPtr = (Char *)0x0;
  Initialize(this,local_30d8,&local_3048,(Uint32)Args_1,sVar28,&local_30c8);
  local_30a8.
  super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  ._M_impl.super__Vector_impl_data._M_start = (ShaderCodeBufferDescX *)0x0;
  local_30a8.
  super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = (ShaderCodeBufferDescX *)0x0;
  local_30a8.
  super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (CONCAT44(local_2258._12_4_,local_2258._8_4_) == 0) {
    local_3134 = 0;
  }
  else {
    pIVar19 = (IMemoryAllocator *)(CONCAT44(local_2258._12_4_,local_2258._8_4_) * 0x30);
    local_3134 = 0;
    pRVar29 = (Resource *)local_2258._0_8_;
    do {
      psVar10 = diligent_spirv_cross::Compiler::get_name_abi_cxx11_
                          (&local_2ec0,(ID)(pRVar29->id).id);
      if (psVar10->_M_string_length == 0) {
        psVar10 = &pRVar29->name;
      }
      psVar14 = &pRVar29->name;
      if (((ulong)local_30d0 & 1) != 0) {
        psVar14 = psVar10;
      }
      local_30d8 = pIVar19;
      pSVar15 = diligent_spirv_cross::Compiler::get_type(&local_2ec0,(TypeID)(pRVar29->type_id).id);
      sVar28 = diligent_spirv_cross::Compiler::get_declared_struct_size(&local_2ec0,pSVar15);
      pSVar16 = GetResAttribs(this,local_3134,(uint)this->m_StorageBufferOffset,0);
      sVar12 = psVar14->_M_string_length;
      Args_1 = (char (*) [22])StringPool::Allocate(&local_30c8,sVar12 + 1);
      if (sVar12 != 0) {
        memcpy(Args_1,(psVar14->_M_dataplus)._M_p,sVar12);
      }
      (*Args_1)[sVar12] = '\0';
      SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
                (pSVar16,&local_2ec0,pRVar29,(char *)Args_1,UniformBuffer,(Uint32)sVar28,0);
      pIVar19 = local_30d8;
      if (LoadUniformBufferReflection) {
        Args_1 = (char (*) [22])(ulong)this->m_IsHLSLSource;
        LoadUBReflection((ShaderCodeBufferDescX *)local_3128,&local_2ec0,pRVar29,
                         this->m_IsHLSLSource);
        std::
        vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>::
        emplace_back<Diligent::ShaderCodeBufferDescX>
                  (&local_30a8,(ShaderCodeBufferDescX *)local_3128);
        std::
        vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
        ::~vector(&local_3118);
      }
      pRVar29 = pRVar29 + 1;
      local_3134 = local_3134 + 1;
      pIVar19 = pIVar19 + -6;
    } while (pIVar19 != (IMemoryAllocator *)0x0);
  }
  if (local_3134 != this->m_StorageBufferOffset) {
    FormatString<char[26],char[22]>
              ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrUB == GetNumUBs()",Args_1);
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x214);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (CONCAT44(local_20c0[0].
               super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
               local_20c0[0].
               super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
               ._M_impl.super__Vector_impl_data._M_finish._0_4_) == 0) {
    local_3134 = 0;
  }
  else {
    local_3070 = (ID *)((long)&(local_20c0[0].
                                super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                               super_ShaderCodeVariableDesc +
                       CONCAT44(local_20c0[0].
                                super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                local_20c0[0].
                                super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                ._M_impl.super__Vector_impl_data._M_finish._0_4_) * 0x30);
    local_3134 = 0;
    do {
      psVar14 = (string *)
                &((local_20c0[0].
                   super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_ShaderCodeVariableDesc).Class;
      diligent_spirv_cross::Compiler::get_buffer_block_flags
                ((Bitset *)local_3128,&local_2ec0,
                 (VariableID)*(uint32_t *)((long)(psVar14 + -1) + 0x10));
      uVar3 = (uint)local_3128._0_4_ >> 0x18;
      pSVar15 = diligent_spirv_cross::Compiler::get_type
                          (&local_2ec0,(TypeID)*(uint32_t *)((long)(psVar14 + -1) + 0x14));
      local_30d0 = psVar14;
      local_30d8 = (IMemoryAllocator *)
                   diligent_spirv_cross::Compiler::get_declared_struct_size(&local_2ec0,pSVar15);
      sVar28 = diligent_spirv_cross::Compiler::get_declared_struct_size_runtime_array
                         (&local_2ec0,pSVar15,1);
      local_3068 = GetResAttribs(this,local_3134,
                                 (uint)this->m_StorageImageOffset -
                                 (uint)this->m_StorageBufferOffset,(uint)this->m_StorageBufferOffset
                                );
      sVar12 = psVar14->_M_string_length;
      pCVar17 = StringPool::Allocate(&local_30c8,sVar12 + 1);
      psVar10 = local_30d0;
      if (sVar12 != 0) {
        memcpy(pCVar17,(local_30d0->_M_dataplus)._M_p,sVar12);
      }
      pCVar17[sVar12] = '\0';
      local_3134 = local_3134 + 1;
      SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
                (local_3068,&local_2ec0,(Resource *)((long)(psVar14 + -1) + 0x10),pCVar17,
                 RWStorageBuffer - ((uVar3 & 1) != 0),(Uint32)local_30d8,
                 (int)sVar28 - (Uint32)local_30d8);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)(local_3128 + 8));
      local_20c0[0].
      super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(psVar10 + 1);
    } while (psVar14 + 1 != (string *)local_3070);
  }
  if (local_3134 != (uint)this->m_StorageImageOffset - (uint)this->m_StorageBufferOffset) {
    FormatString<char[26],char[22]>
              ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSB == GetNumSBs()",
               (char (*) [22])(ulong)this->m_StorageBufferOffset);
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x22d);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (CONCAT44(uStack_18bc,local_18c0) == 0) {
    local_3134 = 0;
  }
  else {
    lVar21 = CONCAT44(uStack_18bc,local_18c0) * 0x30;
    local_3134 = 0;
    pRVar29 = local_18c8;
    do {
      pSVar15 = diligent_spirv_cross::Compiler::get_type(&local_2ec0,(TypeID)(pRVar29->type_id).id);
      DVar1 = (pSVar15->image).dim;
      pSVar16 = GetResAttribs(this,local_3134,
                              (uint)this->m_AtomicCounterOffset - (uint)this->m_SampledImageOffset,
                              (uint)this->m_SampledImageOffset);
      sVar12 = (pRVar29->name)._M_string_length;
      pCVar17 = StringPool::Allocate(&local_30c8,sVar12 + 1);
      if (sVar12 != 0) {
        memcpy(pCVar17,(pRVar29->name)._M_dataplus._M_p,sVar12);
      }
      pCVar17[sVar12] = '\0';
      local_3134 = local_3134 + 1;
      SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
                (pSVar16,&local_2ec0,pRVar29,pCVar17,(DVar1 != Buffer) * '\x03' + UniformTexelBuffer
                 ,0,0);
      pRVar29 = pRVar29 + 1;
      lVar21 = lVar21 + -0x30;
    } while (lVar21 != 0);
  }
  if (local_3134 != (uint)this->m_AtomicCounterOffset - (uint)this->m_SampledImageOffset) {
    FormatString<char[26],char[33]>
              ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSmplImg == GetNumSmpldImgs()",
               (char (*) [33])(ulong)this->m_SampledImageOffset);
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x240);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (CONCAT44(local_1a60[0].TypeName._4_4_,local_1a60[0].TypeName._0_4_) == 0) {
    local_3134 = 0;
  }
  else {
    lVar21 = CONCAT44(local_1a60[0].TypeName._4_4_,local_1a60[0].TypeName._0_4_) * 0x30;
    local_3134 = 0;
    pRVar29 = (Resource *)local_1a60[0].Name;
    do {
      pSVar15 = diligent_spirv_cross::Compiler::get_type(&local_2ec0,(TypeID)(pRVar29->type_id).id);
      DVar1 = (pSVar15->image).dim;
      pSVar16 = GetResAttribs(this,local_3134,
                              (uint)this->m_SampledImageOffset - (uint)this->m_StorageImageOffset,
                              (uint)this->m_StorageImageOffset);
      sVar12 = (pRVar29->name)._M_string_length;
      pCVar17 = StringPool::Allocate(&local_30c8,sVar12 + 1);
      if (sVar12 != 0) {
        memcpy(pCVar17,(pRVar29->name)._M_dataplus._M_p,sVar12);
      }
      pCVar17[sVar12] = '\0';
      local_3134 = local_3134 + 1;
      SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
                (pSVar16,&local_2ec0,pRVar29,pCVar17,DVar1 == Buffer ^ StorageImage,0,0);
      pRVar29 = pRVar29 + 1;
      lVar21 = lVar21 + -0x30;
    } while (lVar21 != 0);
  }
  if (local_3134 != (uint)this->m_SampledImageOffset - (uint)this->m_StorageImageOffset) {
    FormatString<char[26],char[24]>
              ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrImg == GetNumImgs()",
               (char (*) [24])(ulong)this->m_StorageImageOffset);
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x253);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (CONCAT44(uStack_1724,local_1728) == 0) {
    UVar24 = 0;
  }
  else {
    lVar21 = CONCAT44(uStack_1724,local_1728) * 0x30;
    UVar24 = 0;
    pRVar29 = local_1730;
    do {
      pSVar16 = GetResAttribs(this,UVar24,
                              (uint)this->m_SeparateSamplerOffset -
                              (uint)this->m_AtomicCounterOffset,(uint)this->m_AtomicCounterOffset);
      sVar12 = (pRVar29->name)._M_string_length;
      pCVar17 = StringPool::Allocate(&local_30c8,sVar12 + 1);
      if (sVar12 != 0) {
        memcpy(pCVar17,(pRVar29->name)._M_dataplus._M_p,sVar12);
      }
      pCVar17[sVar12] = '\0';
      UVar24 = UVar24 + 1;
      SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
                (pSVar16,&local_2ec0,pRVar29,pCVar17,AtomicCounter,0,0);
      pRVar29 = pRVar29 + 1;
      lVar21 = lVar21 + -0x30;
    } while (lVar21 != 0);
  }
  if (UVar24 != (uint)this->m_SeparateSamplerOffset - (uint)this->m_AtomicCounterOffset) {
    FormatString<char[26],char[22]>
              ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrAC == GetNumACs()",
               (char (*) [22])(ulong)this->m_AtomicCounterOffset);
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x262);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (CONCAT44(uStack_d94,local_d98) == 0) {
    UVar24 = 0;
  }
  else {
    lVar21 = CONCAT44(uStack_d94,local_d98) * 0x30;
    UVar24 = 0;
    pRVar29 = local_da0;
    do {
      pSVar16 = GetResAttribs(this,UVar24,
                              (uint)this->m_SeparateImageOffset -
                              (uint)this->m_SeparateSamplerOffset,
                              (uint)this->m_SeparateSamplerOffset);
      sVar12 = (pRVar29->name)._M_string_length;
      pCVar17 = StringPool::Allocate(&local_30c8,sVar12 + 1);
      if (sVar12 != 0) {
        memcpy(pCVar17,(pRVar29->name)._M_dataplus._M_p,sVar12);
      }
      pCVar17[sVar12] = '\0';
      UVar24 = UVar24 + 1;
      SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
                (pSVar16,&local_2ec0,pRVar29,pCVar17,SeparateSampler,0,0);
      pRVar29 = pRVar29 + 1;
      lVar21 = lVar21 + -0x30;
    } while (lVar21 != 0);
  }
  if (UVar24 != (uint)this->m_SeparateImageOffset - (uint)this->m_SeparateSamplerOffset) {
    FormatString<char[26],char[33]>
              ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSepSmpl == GetNumSepSmplrs()",
               (char (*) [33])(ulong)this->m_SeparateSamplerOffset);
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x271);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (CONCAT44(local_f38[0].super_ShaderCodeVariableDesc.TypeName._4_4_,
               local_f38[0].super_ShaderCodeVariableDesc.TypeName._0_4_) == 0) {
    local_3134 = 0;
  }
  else {
    lVar21 = CONCAT44(local_f38[0].super_ShaderCodeVariableDesc.TypeName._4_4_,
                      local_f38[0].super_ShaderCodeVariableDesc.TypeName._0_4_) * 0x30;
    local_3134 = 0;
    pRVar29 = (Resource *)local_f38[0].super_ShaderCodeVariableDesc.Name;
    do {
      pSVar15 = diligent_spirv_cross::Compiler::get_type(&local_2ec0,(TypeID)(pRVar29->type_id).id);
      DVar1 = (pSVar15->image).dim;
      pSVar16 = GetResAttribs(this,local_3134,
                              (uint)this->m_InputAttachmentOffset -
                              (uint)this->m_SeparateImageOffset,(uint)this->m_SeparateImageOffset);
      sVar12 = (pRVar29->name)._M_string_length;
      pCVar17 = StringPool::Allocate(&local_30c8,sVar12 + 1);
      if (sVar12 != 0) {
        memcpy(pCVar17,(pRVar29->name)._M_dataplus._M_p,sVar12);
      }
      pCVar17[sVar12] = '\0';
      local_3134 = local_3134 + 1;
      SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
                (pSVar16,&local_2ec0,pRVar29,pCVar17,(DVar1 != Buffer) * '\x05' + UniformTexelBuffer
                 ,0,0);
      pRVar29 = pRVar29 + 1;
      lVar21 = lVar21 + -0x30;
    } while (lVar21 != 0);
  }
  if (local_3134 != (uint)this->m_InputAttachmentOffset - (uint)this->m_SeparateImageOffset) {
    FormatString<char[26],char[30]>
              ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSepImg == GetNumSepImgs()",
               (char (*) [30])(ulong)this->m_SeparateImageOffset);
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x285);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (CONCAT44(uStack_1bec,local_1bf0) == 0) {
    UVar24 = 0;
  }
  else {
    lVar21 = CONCAT44(uStack_1bec,local_1bf0) * 0x30;
    UVar24 = 0;
    pRVar29 = local_1bf8;
    do {
      pSVar16 = GetResAttribs(this,UVar24,
                              (uint)this->m_AccelStructOffset - (uint)this->m_InputAttachmentOffset,
                              (uint)this->m_InputAttachmentOffset);
      sVar12 = (pRVar29->name)._M_string_length;
      pCVar17 = StringPool::Allocate(&local_30c8,sVar12 + 1);
      if (sVar12 != 0) {
        memcpy(pCVar17,(pRVar29->name)._M_dataplus._M_p,sVar12);
      }
      pCVar17[sVar12] = '\0';
      UVar24 = UVar24 + 1;
      SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
                (pSVar16,&local_2ec0,pRVar29,pCVar17,InputAttachment,0,0);
      pRVar29 = pRVar29 + 1;
      lVar21 = lVar21 + -0x30;
    } while (lVar21 != 0);
  }
  if (UVar24 != (uint)this->m_AccelStructOffset - (uint)this->m_InputAttachmentOffset) {
    FormatString<char[26],char[37]>
              ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSubpassInput == GetNumInptAtts()",
               (char (*) [37])(ulong)this->m_InputAttachmentOffset);
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x294);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (CONCAT44(uStack_158c,local_1590) == 0) {
    UVar24 = 0;
  }
  else {
    lVar21 = CONCAT44(uStack_158c,local_1590) * 0x30;
    UVar24 = 0;
    Res._M_nxt = local_1598._M_nxt;
    do {
      pSVar16 = GetResAttribs(this,UVar24,
                              (uint)this->m_TotalResources - (uint)this->m_AccelStructOffset,
                              (uint)this->m_AccelStructOffset);
      sVar12 = (((Resource *)Res._M_nxt)->name)._M_string_length;
      pCVar17 = StringPool::Allocate(&local_30c8,sVar12 + 1);
      if (sVar12 != 0) {
        memcpy(pCVar17,(((Resource *)Res._M_nxt)->name)._M_dataplus._M_p,sVar12);
      }
      pCVar17[sVar12] = '\0';
      UVar24 = UVar24 + 1;
      SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
                (pSVar16,&local_2ec0,(Resource *)Res._M_nxt,pCVar17,AccelerationStructure,0,0);
      Res._M_nxt = Res._M_nxt + 0x30;
      lVar21 = lVar21 + -0x30;
    } while (lVar21 != 0);
  }
  pcVar26 = local_3078;
  paVar31 = local_3080;
  pSVar23 = local_30e0;
  Args_1_01 = (char (*) [44])(ulong)this->m_AccelStructOffset;
  if (UVar24 != (uint)this->m_TotalResources - (uint)this->m_AccelStructOffset) {
    FormatString<char[26],char[40]>
              ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrAccelStruct == GetNumAccelStructs()",(char (*) [40])Args_1_01);
    Args_1_01 = (char (*) [44])0x2a3;
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x2a3);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (pcVar26 != (char *)0x0) {
    pCVar17 = StringPool::CopyString(&local_30c8,pcVar26);
    this->m_CombinedSamplerSuffix = pCVar17;
  }
  pCVar17 = StringPool::CopyString(&local_30c8,(pSVar23->super_DeviceObjectAttribs).Name);
  this->m_ShaderName = pCVar17;
  if ((char)local_30e4 != '\0') {
    if (local_1f20 == 0) {
      local_3134 = 0;
    }
    else {
      lVar21 = local_1f20 * 0x30;
      local_3134 = 0;
      pRVar29 = local_1f28;
      do {
        bVar7 = diligent_spirv_cross::Compiler::has_decoration
                          (&local_2ec0,(ID)(pRVar29->id).id,DecorationHlslSemanticGOOGLE);
        if (bVar7) {
          psVar10 = diligent_spirv_cross::Compiler::get_decoration_string_abi_cxx11_
                              (&local_2ec0,(ID)(pRVar29->id).id,DecorationHlslSemanticGOOGLE);
          pSVar18 = GetShaderStageInputAttribs(this,local_3134);
          sVar12 = psVar10->_M_string_length;
          pCVar17 = StringPool::Allocate(&local_30c8,sVar12 + 1);
          if (sVar12 != 0) {
            memcpy(pCVar17,(psVar10->_M_dataplus)._M_p,sVar12);
          }
          pCVar17[sVar12] = '\0';
          uVar9 = GetDecorationOffset(&local_2ec0,pRVar29,DecorationLocation);
          local_3134 = local_3134 + 1;
          pSVar18->Semantic = pCVar17;
          pSVar18->LocationDecorationOffset = uVar9;
        }
        pRVar29 = pRVar29 + 1;
        lVar21 = lVar21 + -0x30;
      } while (lVar21 != 0);
    }
    paVar31 = local_3080;
    pSVar23 = local_30e0;
    if (local_3134 != this->m_NumShaderStageInputs) {
      FormatString<char[26],char[44]>
                ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CurrStageInput == GetNumShaderStageInputs()",Args_1_01);
      Args_1_01 = (char (*) [44])0x2be;
      DebugAssertionFailed
                ((Char *)local_3128._0_8_,"SPIRVShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x2be);
      if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           *)local_3128._0_8_ != &local_3118) {
        operator_delete((void *)local_3128._0_8_,
                        (long)local_3118.
                              super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
  }
  sVar28 = StringPool::GetRemainingSize(&local_30c8);
  if (sVar28 != 0) {
    FormatString<char[25]>((string *)local_3128,(char (*) [25])"Names pool must be empty");
    Args_1_01 = (char (*) [44])0x2c1;
    DebugAssertionFailed
              ((Char *)local_3128._0_8_,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x2c1);
    if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         *)local_3128._0_8_ != &local_3118) {
      operator_delete((void *)local_3128._0_8_,
                      (long)local_3118.
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (pSVar23->ShaderType == SHADER_TYPE_COMPUTE) {
    lVar21 = 0;
    do {
      uVar9 = diligent_spirv_cross::Compiler::get_execution_mode_argument
                        (&local_2ec0,ExecutionModeLocalSize,(uint32_t)lVar21);
      paVar31->_M_elems[lVar21] = uVar9;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
  }
  if (local_30a8.
      super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_30a8.
      super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (!LoadUniformBufferReflection) {
      FormatString<char[26],char[28]>
                ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"LoadUniformBufferReflection",(char (*) [28])Args_1_01);
      DebugAssertionFailed
                ((Char *)local_3128._0_8_,"SPIRVShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x2cb);
      if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           *)local_3128._0_8_ != &local_3118) {
        operator_delete((void *)local_3128._0_8_,
                        (long)local_3118.
                              super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
    Args_1_02 = (char (*) [36])
                (((long)local_30a8.
                        super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_30a8.
                        super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
    if ((long)Args_1_02 - (ulong)this->m_StorageBufferOffset != 0) {
      FormatString<char[26],char[36]>
                ((string *)local_3128,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"UBReflections.size() == GetNumUBs()",Args_1_02);
      DebugAssertionFailed
                ((Char *)local_3128._0_8_,"SPIRVShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x2cc);
      if ((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           *)local_3128._0_8_ != &local_3118) {
        operator_delete((void *)local_3128._0_8_,
                        (long)local_3118.
                              super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
    RangeEnd = local_30a8.
               super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    RangeStart = local_30a8.
                 super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    pIVar19 = GetRawAllocator();
    ShaderCodeBufferDescX::
    PackArray<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeBufferDescX_const*,std::vector<Diligent::ShaderCodeBufferDescX,std::allocator<Diligent::ShaderCodeBufferDescX>>>>
              ((ShaderCodeBufferDescX *)local_3128,
               (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                )RangeStart,
               (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                )RangeEnd,pIVar19);
    puVar6 = local_3088;
    uVar5 = local_3128._8_8_;
    local_3128._8_8_ = (ShaderCodeVariableDesc *)0x0;
    ptr = (this->m_UBReflectionBuffer)._M_t.
          super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
          super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
          super__Head_base<0UL,_void_*,_false>._M_head_impl;
    (this->m_UBReflectionBuffer)._M_t.
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)uVar5;
    if (ptr != (void *)0x0) {
      STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                ((STDDeleter<void,_Diligent::IMemoryAllocator> *)local_3088,ptr);
    }
    (puVar6->_M_t).
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
    _M_head_impl = (STDDeleter<void,_Diligent::IMemoryAllocator>)local_3128._0_8_;
    local_3128._0_8_ =
         (vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          *)0x0;
    if ((ShaderCodeVariableDesc *)local_3128._8_8_ != (ShaderCodeVariableDesc *)0x0) {
      STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                ((STDDeleter<void,_Diligent::IMemoryAllocator> *)local_3128,(void *)local_3128._8_8_
                );
    }
  }
  std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>::
  ~vector(&local_30a8);
  StringPool::~StringPool(&local_30c8);
  diligent_spirv_cross::ShaderResources::~ShaderResources((ShaderResources *)local_2258);
  diligent_spirv_cross::SmallVector<diligent_spirv_cross::EntryPoint,_8UL>::~SmallVector
            (&local_3018);
  diligent_spirv_cross::Compiler::~Compiler(&local_2ec0);
  local_858._2008_8_ = 0;
  if ((pair<unsigned_int,_unsigned_int> *)local_858._2000_8_ !=
      (pair<unsigned_int,_unsigned_int> *)(local_858 + 0x7e8)) {
    free((void *)local_858._2000_8_);
  }
  local_858._1952_8_ = 0;
  if ((undefined1 *)local_858._1944_8_ != local_858 + 0x7b0) {
    free((void *)local_858._1944_8_);
  }
  diligent_spirv_cross::ParsedIR::~ParsedIR((ParsedIR *)local_858);
  return;
}

Assistant:

SPIRVShaderResources::SPIRVShaderResources(IMemoryAllocator&     Allocator,
                                           std::vector<uint32_t> spirv_binary,
                                           const ShaderDesc&     shaderDesc,
                                           const char*           CombinedSamplerSuffix,
                                           bool                  LoadShaderStageInputs,
                                           bool                  LoadUniformBufferReflection,
                                           std::string&          EntryPoint) noexcept(false) :
    m_ShaderType{shaderDesc.ShaderType}
{
    // https://github.com/KhronosGroup/SPIRV-Cross/wiki/Reflection-API-user-guide
    diligent_spirv_cross::Parser parser{std::move(spirv_binary)};
    parser.parse();
    const auto ParsedIRSource = parser.get_parsed_ir().source;
    m_IsHLSLSource            = ParsedIRSource.hlsl;
    diligent_spirv_cross::Compiler Compiler{std::move(parser.get_parsed_ir())};

    spv::ExecutionModel ExecutionModel = ShaderTypeToSpvExecutionModel(shaderDesc.ShaderType);
    auto                EntryPoints    = Compiler.get_entry_points_and_stages();
    for (const auto& CurrEntryPoint : EntryPoints)
    {
        if (CurrEntryPoint.execution_model == ExecutionModel)
        {
            if (!EntryPoint.empty())
            {
                LOG_WARNING_MESSAGE("More than one entry point of type ", GetShaderTypeLiteralName(shaderDesc.ShaderType), " found in SPIRV binary for shader '", shaderDesc.Name, "'. The first one ('", EntryPoint, "') will be used.");
            }
            else
            {
                EntryPoint = CurrEntryPoint.name;
            }
        }
    }
    if (EntryPoint.empty())
    {
        LOG_ERROR_AND_THROW("Unable to find entry point of type ", GetShaderTypeLiteralName(shaderDesc.ShaderType), " in SPIRV binary for shader '", shaderDesc.Name, "'");
    }
    Compiler.set_entry_point(EntryPoint, ExecutionModel);

    // The SPIR-V is now parsed, and we can perform reflection on it.
    diligent_spirv_cross::ShaderResources resources = Compiler.get_shader_resources();

    size_t ResourceNamesPoolSize = 0;
    for (const auto& ub : resources.uniform_buffers)
        ResourceNamesPoolSize += GetUBName(Compiler, ub, ParsedIRSource).length() + 1;
    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please account for the new resource type below");
    for (auto* pResType :
         {
             &resources.storage_buffers,
             &resources.storage_images,
             &resources.sampled_images,
             &resources.atomic_counters,
             &resources.separate_images,
             &resources.separate_samplers,
             &resources.subpass_inputs,
             &resources.acceleration_structures //
         })                                     //
    {
        for (const auto& res : *pResType)
            ResourceNamesPoolSize += res.name.length() + 1;
    }

    if (CombinedSamplerSuffix != nullptr)
    {
        ResourceNamesPoolSize += strlen(CombinedSamplerSuffix) + 1;
    }

    VERIFY_EXPR(shaderDesc.Name != nullptr);
    ResourceNamesPoolSize += strlen(shaderDesc.Name) + 1;

    Uint32 NumShaderStageInputs = 0;

    if (!m_IsHLSLSource || resources.stage_inputs.empty())
        LoadShaderStageInputs = false;
    if (LoadShaderStageInputs)
    {
        const auto& Extensions         = Compiler.get_declared_extensions();
        bool        HlslFunctionality1 = false;
        for (const auto& ext : Extensions)
        {
            HlslFunctionality1 = (ext == "SPV_GOOGLE_hlsl_functionality1");
            if (HlslFunctionality1)
                break;
        }

        if (HlslFunctionality1)
        {
            for (const auto& Input : resources.stage_inputs)
            {
                if (Compiler.has_decoration(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE))
                {
                    const auto& Semantic = Compiler.get_decoration_string(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE);
                    ResourceNamesPoolSize += Semantic.length() + 1;
                    ++NumShaderStageInputs;
                }
                else
                {
                    LOG_ERROR_MESSAGE("Shader input '", Input.name, "' does not have DecorationHlslSemanticGOOGLE decoration, which is unexpected as the shader declares SPV_GOOGLE_hlsl_functionality1 extension");
                }
            }
        }
        else
        {
            LoadShaderStageInputs = false;
            if (m_IsHLSLSource)
            {
                LOG_WARNING_MESSAGE("SPIRV byte code of shader '", shaderDesc.Name,
                                    "' does not use SPV_GOOGLE_hlsl_functionality1 extension. "
                                    "As a result, it is not possible to get semantics of shader inputs and map them to proper locations. "
                                    "The shader will still work correctly if all attributes are declared in ascending order without any gaps. "
                                    "Enable SPV_GOOGLE_hlsl_functionality1 in your compiler to allow proper mapping of vertex shader inputs.");
            }
        }
    }

    ResourceCounters ResCounters;
    ResCounters.NumUBs          = static_cast<Uint32>(resources.uniform_buffers.size());
    ResCounters.NumSBs          = static_cast<Uint32>(resources.storage_buffers.size());
    ResCounters.NumImgs         = static_cast<Uint32>(resources.storage_images.size());
    ResCounters.NumSmpldImgs    = static_cast<Uint32>(resources.sampled_images.size());
    ResCounters.NumACs          = static_cast<Uint32>(resources.atomic_counters.size());
    ResCounters.NumSepSmplrs    = static_cast<Uint32>(resources.separate_samplers.size());
    ResCounters.NumSepImgs      = static_cast<Uint32>(resources.separate_images.size());
    ResCounters.NumInptAtts     = static_cast<Uint32>(resources.subpass_inputs.size());
    ResCounters.NumAccelStructs = static_cast<Uint32>(resources.acceleration_structures.size());
    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please set the new resource type counter here");

    // Resource names pool is only needed to facilitate string allocation.
    StringPool ResourceNamesPool;
    Initialize(Allocator, ResCounters, NumShaderStageInputs, ResourceNamesPoolSize, ResourceNamesPool);

    // Uniform buffer reflections
    std::vector<ShaderCodeBufferDescX> UBReflections;

    {
        Uint32 CurrUB = 0;
        for (const auto& UB : resources.uniform_buffers)
        {
            const auto& name = GetUBName(Compiler, UB, ParsedIRSource);
            const auto& Type = Compiler.get_type(UB.type_id);
            const auto  Size = Compiler.get_declared_struct_size(Type);
            new (&GetUB(CurrUB++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    UB,
                    ResourceNamesPool.CopyString(name),
                    SPIRVShaderResourceAttribs::ResourceType::UniformBuffer,
                    static_cast<Uint32>(Size) //
                };

            if (LoadUniformBufferReflection)
            {
                UBReflections.emplace_back(LoadUBReflection(Compiler, UB, m_IsHLSLSource));
            }
        }
        VERIFY_EXPR(CurrUB == GetNumUBs());
    }

    {
        Uint32 CurrSB = 0;
        for (const auto& SB : resources.storage_buffers)
        {
            auto BufferFlags = Compiler.get_buffer_block_flags(SB.id);
            auto IsReadOnly  = BufferFlags.get(spv::DecorationNonWritable);
            auto ResType     = IsReadOnly ?
                SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer :
                SPIRVShaderResourceAttribs::ResourceType::RWStorageBuffer;
            const auto& Type   = Compiler.get_type(SB.type_id);
            const auto  Size   = Compiler.get_declared_struct_size(Type);
            const auto  Stride = Compiler.get_declared_struct_size_runtime_array(Type, 1) - Size;
            new (&GetSB(CurrSB++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SB,
                    ResourceNamesPool.CopyString(SB.name),
                    ResType,
                    static_cast<Uint32>(Size),
                    static_cast<Uint32>(Stride) //
                };
        }
        VERIFY_EXPR(CurrSB == GetNumSBs());
    }

    {
        Uint32 CurrSmplImg = 0;
        for (const auto& SmplImg : resources.sampled_images)
        {
            const auto& type    = Compiler.get_type(SmplImg.type_id);
            auto        ResType = type.image.dim == spv::DimBuffer ?
                SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer :
                SPIRVShaderResourceAttribs::ResourceType::SampledImage;
            new (&GetSmpldImg(CurrSmplImg++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SmplImg,
                    ResourceNamesPool.CopyString(SmplImg.name),
                    ResType //
                };
        }
        VERIFY_EXPR(CurrSmplImg == GetNumSmpldImgs());
    }

    {
        Uint32 CurrImg = 0;
        for (const auto& Img : resources.storage_images)
        {
            const auto& type    = Compiler.get_type(Img.type_id);
            auto        ResType = type.image.dim == spv::DimBuffer ?
                SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer :
                SPIRVShaderResourceAttribs::ResourceType::StorageImage;
            new (&GetImg(CurrImg++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    Img,
                    ResourceNamesPool.CopyString(Img.name),
                    ResType //
                };
        }
        VERIFY_EXPR(CurrImg == GetNumImgs());
    }

    {
        Uint32 CurrAC = 0;
        for (const auto& AC : resources.atomic_counters)
        {
            new (&GetAC(CurrAC++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    AC,
                    ResourceNamesPool.CopyString(AC.name),
                    SPIRVShaderResourceAttribs::ResourceType::AtomicCounter //
                };
        }
        VERIFY_EXPR(CurrAC == GetNumACs());
    }

    {
        Uint32 CurrSepSmpl = 0;
        for (const auto& SepSam : resources.separate_samplers)
        {
            new (&GetSepSmplr(CurrSepSmpl++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SepSam,
                    ResourceNamesPool.CopyString(SepSam.name),
                    SPIRVShaderResourceAttribs::ResourceType::SeparateSampler //
                };
        }
        VERIFY_EXPR(CurrSepSmpl == GetNumSepSmplrs());
    }

    {
        Uint32 CurrSepImg = 0;
        for (const auto& SepImg : resources.separate_images)
        {
            const auto& type    = Compiler.get_type(SepImg.type_id);
            const auto  ResType = type.image.dim == spv::DimBuffer ?
                SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer :
                SPIRVShaderResourceAttribs::ResourceType::SeparateImage;

            new (&GetSepImg(CurrSepImg++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SepImg,
                    ResourceNamesPool.CopyString(SepImg.name),
                    ResType //
                };
        }
        VERIFY_EXPR(CurrSepImg == GetNumSepImgs());
    }

    {
        Uint32 CurrSubpassInput = 0;
        for (const auto& SubpassInput : resources.subpass_inputs)
        {
            new (&GetInptAtt(CurrSubpassInput++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SubpassInput,
                    ResourceNamesPool.CopyString(SubpassInput.name),
                    SPIRVShaderResourceAttribs::ResourceType::InputAttachment //
                };
        }
        VERIFY_EXPR(CurrSubpassInput == GetNumInptAtts());
    }

    {
        Uint32 CurrAccelStruct = 0;
        for (const auto& AccelStruct : resources.acceleration_structures)
        {
            new (&GetAccelStruct(CurrAccelStruct++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    AccelStruct,
                    ResourceNamesPool.CopyString(AccelStruct.name),
                    SPIRVShaderResourceAttribs::ResourceType::AccelerationStructure //
                };
        }
        VERIFY_EXPR(CurrAccelStruct == GetNumAccelStructs());
    }

    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please initialize SPIRVShaderResourceAttribs for the new resource type here");

    if (CombinedSamplerSuffix != nullptr)
    {
        m_CombinedSamplerSuffix = ResourceNamesPool.CopyString(CombinedSamplerSuffix);
    }

    m_ShaderName = ResourceNamesPool.CopyString(shaderDesc.Name);

    if (LoadShaderStageInputs)
    {
        Uint32 CurrStageInput = 0;
        for (const auto& Input : resources.stage_inputs)
        {
            if (Compiler.has_decoration(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE))
            {
                const auto& Semantic = Compiler.get_decoration_string(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE);
                new (&GetShaderStageInputAttribs(CurrStageInput++)) SPIRVShaderStageInputAttribs //
                    {
                        ResourceNamesPool.CopyString(Semantic),
                        GetDecorationOffset(Compiler, Input, spv::Decoration::DecorationLocation) //
                    };
            }
        }
        VERIFY_EXPR(CurrStageInput == GetNumShaderStageInputs());
    }

    VERIFY(ResourceNamesPool.GetRemainingSize() == 0, "Names pool must be empty");

    if (shaderDesc.ShaderType == SHADER_TYPE_COMPUTE)
    {
        for (uint32_t i = 0; i < m_ComputeGroupSize.size(); ++i)
            m_ComputeGroupSize[i] = Compiler.get_execution_mode_argument(spv::ExecutionModeLocalSize, i);
    }

    if (!UBReflections.empty())
    {
        VERIFY_EXPR(LoadUniformBufferReflection);
        VERIFY_EXPR(UBReflections.size() == GetNumUBs());
        m_UBReflectionBuffer = ShaderCodeBufferDescX::PackArray(UBReflections.cbegin(), UBReflections.cend(), GetRawAllocator());
    }
    //LOG_INFO_MESSAGE(DumpResources());
}